

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O0

ssize_t __thiscall
sc_core::vcd_T_trace<sc_dt::sc_bv_base>::write
          (vcd_T_trace<sc_dt::sc_bv_base> *this,int __fd,void *__buf,size_t __n)

{
  sc_bv_base *psVar1;
  undefined4 in_register_00000034;
  string *in_stack_00000030;
  vcd_trace *in_stack_00000038;
  sc_bv_base *in_stack_ffffffffffffff78;
  string local_50 [8];
  sc_proxy<sc_dt::sc_bv_base> *in_stack_ffffffffffffffb8;
  string local_30 [32];
  FILE *local_10;
  vcd_T_trace<sc_dt::sc_bv_base> *local_8;
  
  local_10 = (FILE *)CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  sc_dt::sc_proxy<sc_dt::sc_bv_base>::to_string_abi_cxx11_(in_stack_ffffffffffffffb8);
  vcd_trace::compose_line(in_stack_00000038,in_stack_00000030);
  psVar1 = (sc_bv_base *)std::__cxx11::string::c_str();
  fprintf((FILE *)CONCAT44(in_register_00000034,__fd),"%s",psVar1);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  psVar1 = sc_dt::sc_bv_base::operator=(psVar1,in_stack_ffffffffffffff78);
  return (ssize_t)psVar1;
}

Assistant:

void write( FILE* f )
    {
        std::fprintf( f, "%s", compose_line( object.to_string() ).c_str() );
        old_value = object;
    }